

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void ssl_calc_finished_tls(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  long lVar1;
  mbedtls_ssl_session *pmVar2;
  char *pcVar3;
  uchar padbuf [36];
  mbedtls_md5_context md5;
  mbedtls_sha1_context sha1;
  uchar local_108 [36];
  mbedtls_md5_context local_e4;
  mbedtls_sha1_context local_8c;
  
  pmVar2 = ssl->session_negotiate;
  if (pmVar2 == (mbedtls_ssl_session *)0x0) {
    pmVar2 = ssl->session;
  }
  lVar1 = 0;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1256,"=> calc  finished tls");
  mbedtls_md5_init(&local_e4);
  mbedtls_sha1_init(&local_8c);
  mbedtls_md5_clone(&local_e4,&ssl->handshake->fin_md5);
  mbedtls_sha1_clone(&local_8c,&ssl->handshake->fin_sha1);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1266,"finished  md5 state",(uchar *)local_e4.state,0x10);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x126b,"finished sha1 state",(uchar *)local_8c.state,0x14);
  pcVar3 = "server finished";
  if (from == 0) {
    pcVar3 = "client finished";
  }
  mbedtls_md5_finish(&local_e4,local_108);
  mbedtls_sha1_finish(&local_8c,local_108 + 0x10);
  (*ssl->handshake->tls_prf)(pmVar2->master,0x30,pcVar3,local_108,0x24,buf,0xc);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1278,"calc finished result",buf,0xc);
  mbedtls_md5_free(&local_e4);
  mbedtls_sha1_free(&local_8c);
  do {
    local_108[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x24);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x127f,"<= calc  finished");
  return;
}

Assistant:

static void ssl_calc_finished_tls(
                mbedtls_ssl_context *ssl, unsigned char *buf, int from )
{
    int len = 12;
    const char *sender;
    mbedtls_md5_context  md5;
    mbedtls_sha1_context sha1;
    unsigned char padbuf[36];

    mbedtls_ssl_session *session = ssl->session_negotiate;
    if( !session )
        session = ssl->session;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc  finished tls" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

    /*
     * TLSv1:
     *   hash = PRF( master, finished_label,
     *               MD5( handshake ) + SHA1( handshake ) )[0..11]
     */

#if !defined(MBEDTLS_MD5_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished  md5 state", (unsigned char *)
                    md5.state, sizeof(  md5.state ) );
#endif

#if !defined(MBEDTLS_SHA1_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished sha1 state", (unsigned char *)
                   sha1.state, sizeof( sha1.state ) );
#endif

    sender = ( from == MBEDTLS_SSL_IS_CLIENT )
             ? "client finished"
             : "server finished";

    mbedtls_md5_finish(  &md5, padbuf );
    mbedtls_sha1_finish( &sha1, padbuf + 16 );

    ssl->handshake->tls_prf( session->master, 48, sender,
                             padbuf, 36, buf, len );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calc finished result", buf, len );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    mbedtls_zeroize(  padbuf, sizeof(  padbuf ) );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc  finished" ) );
}